

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy_test.cc
# Opt level: O3

void __thiscall
disruptor::test::MultiThreadedStrategy::HasAvailableCapacity::test_method
          (HasAvailableCapacity *this)

{
  atomic<long> *paVar1;
  long lVar2;
  undefined1 uVar3;
  long lVar4;
  long lVar5;
  pointer ppSVar6;
  initializer_list<disruptor::Sequence_*> __l;
  ulong local_218;
  ulong *local_210;
  int64_t *local_208;
  ulong local_200;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined8 *local_1e8;
  int64_t **local_1e0;
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined8 *local_1c8;
  char *local_1c0;
  undefined **local_1b8;
  undefined1 local_1b0;
  undefined8 *local_1a8;
  ulong **local_1a0;
  undefined1 local_198 [8];
  undefined8 local_190;
  shared_count sStack_188;
  MultiThreadedStrategy *local_180;
  int64_t return_value;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> one_dependents;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  Sequence cursor;
  
  cursor.padding0_[0] = (int64_t)&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1;
  __l._M_len = 1;
  __l._M_array = (iterator)&cursor;
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            (&one_dependents,__l,(allocator_type *)&local_1f8);
  cursor.sequence_.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_180 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy;
  return_value = disruptor::MultiThreadedStrategy::IncrementAndGet
                           (local_180,&cursor,&one_dependents,8);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x91);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_0010daa0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_208 = &return_value;
  local_198[0] = return_value == 7;
  local_218 = 7;
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_150 = "";
  local_1e0 = &local_208;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_0010daf0;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_210;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_0010daf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &local_218;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_188);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x93);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_0010daa0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  lVar2 = ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_claimed_sequence_.sequence_.
           super___atomic_base<long>._M_i -
          (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.buffer_size_) + 1;
  if ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_consumer_sequence_.sequence_.
      super___atomic_base<long>._M_i < lVar2) {
    lVar4 = 0x7fffffffffffffff;
    ppSVar6 = one_dependents.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (one_dependents.
        super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        one_dependents.
        super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_consumer_sequence_.sequence_.
      super___atomic_base<long>._M_i = 0x7fffffffffffffff;
      goto LAB_00107d74;
    }
    do {
      lVar5 = ((*ppSVar6)->sequence_).super___atomic_base<long>._M_i;
      if (lVar4 < lVar5) {
        lVar5 = lVar4;
      }
      ppSVar6 = ppSVar6 + 1;
      lVar4 = lVar5;
    } while (ppSVar6 !=
             one_dependents.
             super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_consumer_sequence_.sequence_.
    super___atomic_base<long>._M_i = lVar5;
    if (lVar2 <= lVar5) goto LAB_00107d74;
    local_198[0] = 1;
    uVar3 = 0;
  }
  else {
LAB_00107d74:
    uVar3 = 1;
    local_198[0] = 0;
  }
  local_210 = &local_200;
  local_200 = local_200 & 0xffffffffffffff00;
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_150 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_0010db70;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_208;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_0010db70;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_210;
  local_208 = (int64_t *)&local_218;
  local_218._0_1_ = uVar3;
  boost::test_tools::tt_detail::report_assertion
            (local_198,&local_1d8,&local_158,0x93,1,2,2,
             "strategy.HasAvailableCapacity(one_dependents, cursor.sequence())",&local_1f8,"false",
             &local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_188);
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x98);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_0010daa0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  lVar2 = ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_claimed_sequence_.sequence_.
           super___atomic_base<long>._M_i -
          (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.buffer_size_) + 1;
  if ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_consumer_sequence_.sequence_.
      super___atomic_base<long>._M_i < lVar2) {
    lVar4 = 0x7fffffffffffffff;
    ppSVar6 = one_dependents.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (one_dependents.
        super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        one_dependents.
        super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_consumer_sequence_.sequence_.
      super___atomic_base<long>._M_i = 0x7fffffffffffffff;
    }
    else {
      do {
        lVar5 = ((*ppSVar6)->sequence_).super___atomic_base<long>._M_i;
        if (lVar4 < lVar5) {
          lVar5 = lVar4;
        }
        ppSVar6 = ppSVar6 + 1;
        lVar4 = lVar5;
      } while (ppSVar6 !=
               one_dependents.
               super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy.last_consumer_sequence_.sequence_.
      super___atomic_base<long>._M_i = lVar5;
      if (lVar5 < lVar2) {
        local_198[0] = 0;
        goto LAB_00107f2f;
      }
    }
  }
  local_198[0] = 1;
LAB_00107f2f:
  local_218 = CONCAT71(local_218._1_7_,local_198[0]);
  local_200 = CONCAT71(local_200._1_7_,1);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_150 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_0010db70;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_208;
  local_210 = &local_200;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_0010db70;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_210;
  local_208 = (int64_t *)&local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_198,&local_1d8,&local_158,0x98,1,2,2,
             "strategy.HasAvailableCapacity(one_dependents, cursor.sequence())",&local_1f8,"true",
             &local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_188);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x9c);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_0010daa0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_218 = disruptor::MultiThreadedStrategy::IncrementAndGet(local_180,&cursor,&one_dependents,1)
  ;
  local_200 = return_value + 1;
  local_198[0] = local_218 == local_200;
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_150 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_0010daf0;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_208;
  local_210 = &local_200;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_0010daf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_210;
  local_208 = (int64_t *)&local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_198,&local_1d8,&local_158,0x9c,1,2,2,
             "strategy.IncrementAndGet(cursor, one_dependents)",&local_1f8,"return_value + 1L",
             &local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_188);
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 8;
  UNLOCK();
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0xa4);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_0010daa0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_218 = disruptor::MultiThreadedStrategy::IncrementAndGet(local_180,&cursor,&one_dependents,8)
  ;
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 8;
  UNLOCK();
  local_200 = lVar2 + 8;
  local_198[0] = local_218 == local_200;
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_150 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_0010daf0;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_208;
  local_210 = &local_200;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_0010daf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_210;
  local_208 = (int64_t *)&local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_198,&local_1d8,&local_158,0xa4,1,2,2,
             "strategy.IncrementAndGet(cursor, one_dependents, 8)",&local_1f8,
             "sequence_1.IncrementAndGet(8)",&local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_188);
  if (one_dependents.
      super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(one_dependents.
                    super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(HasAvailableCapacity) {
  auto one_dependents = oneDependents();
  Sequence cursor;

  int64_t return_value =
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(return_value, kInitialCursorValue + RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), false);

  // advance late consumers
  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), true);

  // only one slot free
  BOOST_CHECK_EQUAL(strategy.IncrementAndGet(cursor, one_dependents),
                    return_value + 1L);

  // dependent keeps up
  sequence_1.IncrementAndGet(RING_BUFFER_SIZE);

  // all equals
  BOOST_CHECK_EQUAL(
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE),
      sequence_1.IncrementAndGet(RING_BUFFER_SIZE));
}